

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persp_rh_no.c
# Opt level: O3

void glmc_persp_decomp_rh_no
               (vec4 *proj,float *nearZ,float *farZ,float *top,float *bottom,float *left,
               float *right)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar1 = proj[2][0];
  fVar2 = proj[2][2];
  fVar3 = proj[3][2];
  fVar6 = fVar3 / (fVar2 + -1.0);
  fVar7 = fVar6 / proj[1][1];
  fVar5 = fVar6 / (*proj)[0];
  fVar4 = proj[2][1];
  *nearZ = fVar6;
  *farZ = fVar3 / (fVar2 + 1.0);
  *bottom = (fVar4 + -1.0) * fVar7;
  *top = (fVar4 + 1.0) * fVar7;
  *left = (fVar1 + -1.0) * fVar5;
  *right = (fVar1 + 1.0) * fVar5;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_persp_decomp_rh_no(mat4 proj,
                        float * __restrict nearZ, float * __restrict farZ,
                        float * __restrict top,   float * __restrict bottom,
                        float * __restrict left,  float * __restrict right) {
  glm_persp_decomp_rh_no(proj, nearZ, farZ, top, bottom, left, right);
}